

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::deinit(TessellationShaderTessellationMaxInOut *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  int iVar2;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    if (this->m_ref_vertex_attributes != (GLfloat *)0x0) {
      free(this->m_ref_vertex_attributes);
      this->m_ref_vertex_attributes = (GLfloat *)0x0;
    }
    if (this->m_tf_varyings_names != (char **)0x0) {
      if (7 < this->m_gl_max_tess_evaluation_output_components_value) {
        lVar3 = 0;
        do {
          if (this->m_tf_varyings_names[lVar3] != (char *)0x0) {
            free(this->m_tf_varyings_names[lVar3]);
            this->m_tf_varyings_names[lVar3] = (char *)0x0;
          }
          lVar3 = lVar3 + 1;
          iVar1 = this->m_gl_max_tess_evaluation_output_components_value;
          iVar2 = iVar1 + 3;
          if (-1 < iVar1) {
            iVar2 = iVar1;
          }
        } while (lVar3 < (iVar2 >> 2) + -1);
      }
      free(this->m_tf_varyings_names);
      this->m_tf_varyings_names = (char **)0x0;
    }
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glPatchParameteriEXT() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x8c5);
    (**(code **)(lVar3 + 0xd8))(0);
    if (this->m_fs_id != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_fs_id = 0;
    }
    if (this->m_po_id_1 != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_po_id_1 = 0;
    }
    if (this->m_po_id_2 != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_po_id_2 = 0;
    }
    if (this->m_tcs_id_1 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tcs_id_1 = 0;
    }
    if (this->m_tcs_id_2 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tcs_id_2 = 0;
    }
    if (this->m_tes_id_1 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tes_id_1 = 0;
    }
    if (this->m_tes_id_2 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tes_id_2 = 0;
    }
    if (this->m_vs_id_1 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_vs_id_1 = 0;
    }
    if (this->m_vs_id_2 != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_vs_id_2 = 0;
    }
    if (this->m_tf_bo_id_1 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_tf_bo_id_1);
      this->m_tf_bo_id_1 = 0;
    }
    if (this->m_tf_bo_id_2 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_tf_bo_id_2);
      this->m_tf_bo_id_2 = 0;
    }
    if (this->m_patch_data_bo_id != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_patch_data_bo_id);
      this->m_patch_data_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::deinit(void)
{
	/* Call base class deinitialization routine */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	/* Deallocate dynamic arrays */
	if (m_ref_vertex_attributes != DE_NULL)
	{
		free(m_ref_vertex_attributes);

		m_ref_vertex_attributes = DE_NULL;
	}

	/* Deallocate the varyings array */
	if (m_tf_varyings_names != DE_NULL)
	{
		for (int i = 0; i < (m_gl_max_tess_evaluation_output_components_value) / 4 - 1 /* gl_Position */; i++)
		{
			if (m_tf_varyings_names[i] != DE_NULL)
			{
				free(m_tf_varyings_names[i]);

				m_tf_varyings_names[i] = DE_NULL;
			}
		}

		free(m_tf_varyings_names);

		m_tf_varyings_names = DE_NULL;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GL_PATCH_VERTICES_EXT pname value */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed!");

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release ES objects */
	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_po_id_1 != 0)
	{
		gl.deleteProgram(m_po_id_1);

		m_po_id_1 = 0;
	}

	if (m_po_id_2 != 0)
	{
		gl.deleteProgram(m_po_id_2);

		m_po_id_2 = 0;
	}

	if (m_tcs_id_1 != 0)
	{
		gl.deleteShader(m_tcs_id_1);

		m_tcs_id_1 = 0;
	}

	if (m_tcs_id_2 != 0)
	{
		gl.deleteShader(m_tcs_id_2);

		m_tcs_id_2 = 0;
	}

	if (m_tes_id_1 != 0)
	{
		gl.deleteShader(m_tes_id_1);

		m_tes_id_1 = 0;
	}

	if (m_tes_id_2 != 0)
	{
		gl.deleteShader(m_tes_id_2);

		m_tes_id_2 = 0;
	}

	if (m_vs_id_1 != 0)
	{
		gl.deleteShader(m_vs_id_1);

		m_vs_id_1 = 0;
	}

	if (m_vs_id_2 != 0)
	{
		gl.deleteShader(m_vs_id_2);

		m_vs_id_2 = 0;
	}

	if (m_tf_bo_id_1 != 0)
	{
		gl.deleteBuffers(1, &m_tf_bo_id_1);

		m_tf_bo_id_1 = 0;
	}

	if (m_tf_bo_id_2 != 0)
	{
		gl.deleteBuffers(1, &m_tf_bo_id_2);

		m_tf_bo_id_2 = 0;
	}

	if (m_patch_data_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_patch_data_bo_id);

		m_patch_data_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}